

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadGroup<google::protobuf::Message>
               (int field_number,CodedInputStream *input,Message *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = input->recursion_budget_;
  input->recursion_budget_ = iVar1 + -1;
  if ((0 < iVar1) &&
     (bVar2 = MessageLite::MergePartialFromCodedStream(&value->super_MessageLite,input), bVar2)) {
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
      return input->last_tag_ == field_number * 8 + 4U;
    }
    __assert_fail("recursion_budget_ < recursion_limit_",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.h"
                  ,0x609,
                  "void google::protobuf::io::CodedInputStream::UnsafeDecrementRecursionDepth()");
  }
  return false;
}

Assistant:

inline uint8_t* WireFormatLite::WriteInt64ToArray(int field_number,
                                                  int64_t value,
                                                  uint8_t* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteInt64NoTagToArray(value, target);
}